

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_create_secret.hpp
# Opt level: O1

void __thiscall
duckdb::LogicalCreateSecret::LogicalCreateSecret
          (LogicalCreateSecret *this,CreateSecretInput *secret_input_p)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  pointer pbVar5;
  SecretPersistType SVar6;
  
  LogicalOperator::LogicalOperator(&this->super_LogicalOperator,LOGICAL_CREATE_SECRET);
  (this->super_LogicalOperator)._vptr_LogicalOperator =
       (_func_int **)&PTR__LogicalCreateSecret_024a5f80;
  paVar2 = &(this->secret_input).type.field_2;
  (this->secret_input).type._M_dataplus._M_p = (pointer)paVar2;
  pcVar3 = (secret_input_p->type)._M_dataplus._M_p;
  paVar1 = &(secret_input_p->type).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar1) {
    uVar4 = *(undefined8 *)((long)&(secret_input_p->type).field_2 + 8);
    paVar2->_M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->secret_input).type.field_2 + 8) = uVar4;
  }
  else {
    (this->secret_input).type._M_dataplus._M_p = pcVar3;
    (this->secret_input).type.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  (this->secret_input).type._M_string_length = (secret_input_p->type)._M_string_length;
  (secret_input_p->type)._M_dataplus._M_p = (pointer)paVar1;
  (secret_input_p->type)._M_string_length = 0;
  (secret_input_p->type).field_2._M_local_buf[0] = '\0';
  paVar1 = &(this->secret_input).provider.field_2;
  (this->secret_input).provider._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (secret_input_p->provider)._M_dataplus._M_p;
  paVar2 = &(secret_input_p->provider).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&(secret_input_p->provider).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->secret_input).provider.field_2 + 8) = uVar4;
  }
  else {
    (this->secret_input).provider._M_dataplus._M_p = pcVar3;
    (this->secret_input).provider.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->secret_input).provider._M_string_length = (secret_input_p->provider)._M_string_length;
  (secret_input_p->provider)._M_dataplus._M_p = (pointer)paVar2;
  (secret_input_p->provider)._M_string_length = 0;
  (secret_input_p->provider).field_2._M_local_buf[0] = '\0';
  paVar1 = &(this->secret_input).storage_type.field_2;
  (this->secret_input).storage_type._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (secret_input_p->storage_type)._M_dataplus._M_p;
  paVar2 = &(secret_input_p->storage_type).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&(secret_input_p->storage_type).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->secret_input).storage_type.field_2 + 8) = uVar4;
  }
  else {
    (this->secret_input).storage_type._M_dataplus._M_p = pcVar3;
    (this->secret_input).storage_type.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->secret_input).storage_type._M_string_length =
       (secret_input_p->storage_type)._M_string_length;
  (secret_input_p->storage_type)._M_dataplus._M_p = (pointer)paVar2;
  (secret_input_p->storage_type)._M_string_length = 0;
  (secret_input_p->storage_type).field_2._M_local_buf[0] = '\0';
  paVar1 = &(this->secret_input).name.field_2;
  (this->secret_input).name._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (secret_input_p->name)._M_dataplus._M_p;
  paVar2 = &(secret_input_p->name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&(secret_input_p->name).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->secret_input).name.field_2 + 8) = uVar4;
  }
  else {
    (this->secret_input).name._M_dataplus._M_p = pcVar3;
    (this->secret_input).name.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->secret_input).name._M_string_length = (secret_input_p->name)._M_string_length;
  (secret_input_p->name)._M_dataplus._M_p = (pointer)paVar2;
  (secret_input_p->name)._M_string_length = 0;
  (secret_input_p->name).field_2._M_local_buf[0] = '\0';
  pbVar5 = (secret_input_p->scope).
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->secret_input).scope.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (secret_input_p->scope).
       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->secret_input).scope.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pbVar5;
  (this->secret_input).scope.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (secret_input_p->scope).
       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (secret_input_p->scope).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (secret_input_p->scope).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (secret_input_p->scope).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Hashtable(&(this->secret_input).options._M_h,&secret_input_p->options);
  SVar6 = secret_input_p->persist_type;
  (this->secret_input).on_conflict = secret_input_p->on_conflict;
  (this->secret_input).persist_type = SVar6;
  return;
}

Assistant:

explicit LogicalCreateSecret(CreateSecretInput secret_input_p)
	    : LogicalOperator(LogicalOperatorType::LOGICAL_CREATE_SECRET), secret_input(std::move(secret_input_p)) {
	}